

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

scalar __thiscall absl::make_unique<S2ClosestCellQuery,S2CellIndex*>(absl *this,S2CellIndex **args)

{
  S2CellIndex *index;
  S2ClosestCellQuery *this_00;
  Options local_38;
  
  this_00 = (S2ClosestCellQuery *)operator_new(0x270);
  index = *args;
  local_38.region_ = (S2Region *)0x0;
  local_38.max_results_ = 0;
  local_38.use_brute_force_ = false;
  local_38._29_3_ = 0;
  local_38.max_distance_.super_S1ChordAngle.length2_ = (S1ChordAngle)0.0;
  local_38.max_error_.length2_ = 0.0;
  S2ClosestCellQueryBase<S2MinDistance>::Options::Options(&local_38);
  S2ClosestCellQuery::S2ClosestCellQuery(this_00,index,(Options *)&local_38);
  *(S2ClosestCellQuery **)this = this_00;
  return (__uniq_ptr_data<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>,_true,_true>)
         (__uniq_ptr_data<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>,_true,_true>)
         this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}